

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O3

QList<QCborArray> * __thiscall
QFactoryLoader::metaDataKeys(QList<QCborArray> *__return_storage_ptr__,QFactoryLoader *this)

{
  QMutex *this_00;
  __pointer_type copy;
  pointer puVar1;
  qsizetype qVar2;
  long lVar3;
  byte *pbVar4;
  QCborError QVar5;
  undefined1 *puVar6;
  int iVar7;
  pointer puVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QLatin1StringView key;
  QCborContainerPrivate *local_100;
  QByteArray local_c8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  QCborArray QStack_90;
  undefined1 local_88 [24];
  char *local_70 [3];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QCborArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = &(this->d).mutex;
  if ((this->d).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar10 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar10) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar10) goto LAB_002d349e;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_002d349e:
  puVar8 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar1) {
    do {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCborValue::operator[]
                ((QCborValue *)local_a8,
                 (QCborValue *)
                 &((puVar8->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                   super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl)->metaData,4);
      key.m_data = "Keys";
      key.m_size = 4;
      QCborValue::operator[]((QCborValue *)local_58,(QCborValue *)local_a8,key);
      QCborValue::toArray((QCborValue *)local_70);
      QtPrivate::QMovableArrayOps<QCborArray>::emplace<QCborArray>
                ((QMovableArrayOps<QCborArray> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QCborArray *)local_70);
      QList<QCborArray>::end(__return_storage_ptr__);
      QCborArray::~QCborArray((QCborArray *)local_70);
      QCborValue::~QCborValue((QCborValue *)local_58);
      QCborValue::~QCborValue((QCborValue *)local_a8);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  local_100 = (QCborContainerPrivate *)(this->d).iid.d.ptr;
  if (local_100 == (QCborContainerPrivate *)0x0) {
    local_100 = (QCborContainerPrivate *)&QByteArray::_empty;
  }
  qVar2 = (this->d).iid.d.size;
  QPluginLoader::staticPlugins();
  puVar6 = &DAT_aaaaaaaaaaaaaaaa;
  do {
    lVar3 = *(long *)(puVar6 + 8);
    pbVar4 = *(byte **)(puVar6 + 0x10);
    QStack_90.d.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = local_100;
    local_98 = (undefined1 *)0xaaaaaaaaaaaaaa00;
    local_a8._0_8_ = qVar2;
    QCborArray::QCborArray(&QStack_90);
    if ((*pbVar4 & 0xfe) == 0) {
      local_c8.d.ptr = (char *)(pbVar4 + 4);
      local_c8.d.size = lVar3 + -4;
      local_c8.d.d = (Data *)0x0;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCborStreamReader::QCborStreamReader((QCborStreamReader *)local_88,&local_c8);
      if (local_88[0x10] == 0xa0) {
        bVar10 = QCborStreamReader::_enterContainer_helper((QCborStreamReader *)local_88);
        if (bVar10) {
          do {
            if (local_88[0x10] == 0xff) {
              bVar10 = QCborStreamReader::leaveContainer((QCborStreamReader *)local_88);
              if (!bVar10) break;
              goto LAB_002d3963;
            }
            if (local_88[0x10] < 0x21) {
              uVar9 = -(ulong)(local_88[0x10] == 0x20) ^ local_88._0_8_;
              iVar7 = (int)uVar9;
              if ((long)iVar7 != uVar9) goto LAB_002d3963;
              bVar10 = QCborStreamReader::next((QCborStreamReader *)local_88,10000);
              if (!bVar10) {
                QCborStreamReader::lastError((QCborStreamReader *)local_88);
                goto LAB_002d3963;
              }
              if (iVar7 == 4) {
                if (local_98._0_1_ == true) {
                  iVar7 = -4;
                  if ((local_88[0x10] == 0xa0) &&
                     (bVar10 = QCborStreamReader::isLengthKnown((QCborStreamReader *)local_88),
                     bVar10)) {
                    bVar10 = QCborStreamReader::_enterContainer_helper
                                       ((QCborStreamReader *)local_88);
                    iVar7 = -1;
                    if (bVar10) {
                      do {
                        if (local_88[0x10] == 0xff) {
                          iVar7 = 0;
                          goto LAB_002d3931;
                        }
                        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                        QCborStreamReader::readAllUtf8String
                                  ((QByteArray *)local_58,(QCborStreamReader *)local_88);
                        local_70[0] = "Keys";
                        bVar10 = ::operator==((QByteArray *)local_58,local_70);
                        bVar10 = !bVar10;
                        if (bVar10) {
                          QCborStreamReader::next((QCborStreamReader *)local_88,10000);
                        }
                        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
                          }
                        }
                      } while (bVar10);
                      iVar7 = 0;
                      if (!bVar10) {
                        iVar7 = -4;
                      }
                    }
                  }
                }
                else {
                  iVar7 = 0;
                }
              }
              else if (iVar7 == 2) {
                iVar7 = 1;
                anon_unknown.dwarf_9a8673::QFactoryLoaderIidSearch::operator()
                          ((QFactoryLoaderIidSearch *)local_a8,IID,(QCborStreamReader *)local_88);
              }
              else {
                iVar7 = 1;
                QCborStreamReader::next((QCborStreamReader *)local_88,10000);
              }
            }
            else {
              if (local_88[0x10] != 0x60) goto LAB_002d3963;
              local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QCborStreamReader::readAllUtf8String
                        ((QByteArray *)local_58,(QCborStreamReader *)local_88);
              bVar10 = QByteArray::isNull((QByteArray *)local_58);
              if (bVar10) {
                iVar7 = -0x55555556;
                QCborStreamReader::lastError((QCborStreamReader *)local_88);
              }
              else {
                iVar7 = 1;
                QCborStreamReader::next((QCborStreamReader *)local_88,10000);
              }
              if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
                }
              }
              if (bVar10) goto LAB_002d3963;
            }
LAB_002d3931:
            QVar5 = QCborStreamReader::lastError((QCborStreamReader *)local_88);
            if ((iVar7 != 1) || (QVar5.c != NoError)) goto LAB_002d3963;
          } while( true );
        }
LAB_002d395b:
        QCborStreamReader::lastError((QCborStreamReader *)local_88);
      }
      else if (local_88[0x10] == 0xff) goto LAB_002d395b;
LAB_002d3963:
      metaDataKeys();
    }
    if (local_98._0_1_ == true) {
      QtPrivate::QMovableArrayOps<QCborArray>::emplace<QCborArray>
                ((QMovableArrayOps<QCborArray> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&QStack_90);
      QList<QCborArray>::end(__return_storage_ptr__);
    }
    QCborArray::~QCborArray(&QStack_90);
    puVar6 = puVar6 + 0x18;
    if (puVar6 == (undefined1 *)0xaaaaaaaaaaaaaa9a) {
      LOCK();
      _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
      UNLOCK();
      if (_DAT_aaaaaaaaaaaaaaaa == 0) {
        QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
      }
      LOCK();
      copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (copy != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

QList<QCborArray> QFactoryLoader::metaDataKeys() const
{
    QList<QCborArray> metaData;
#if QT_CONFIG(library)
    QMutexLocker locker(&d->mutex);
    for (const auto &library : d->libraries) {
        const QCborValue md = library->metaData.value(QtPluginMetaDataKeys::MetaData);
        metaData.append(md["Keys"_L1].toArray());
    }
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const auto staticPlugins = QPluginLoader::staticPlugins();
    for (const QStaticPlugin &plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData),
                                  plugin.rawMetaDataSize);
        QFactoryLoaderMetaDataKeysExtractor extractor{ iid };
        iterateInPluginMetaData(pluginData, extractor);
        if (extractor.matchesIid)
            metaData += std::move(extractor.keys);
    }

    // other portions of the code will cast to int (e.g., keyMap())
    Q_ASSERT(metaData.size() <= std::numeric_limits<int>::max());
    return metaData;
}